

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O1

void testOpenScans(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  undefined8 extraout_RAX;
  char *in_RCX;
  exr_context_t f;
  string fn;
  exr_context_initializer_t cinit;
  undefined1 local_b0 [8];
  long *local_a8;
  char *local_a0;
  long local_98 [2];
  undefined8 local_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  std::__cxx11::string::append((char *)&local_a8);
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_28 = 0;
  local_88 = 0x68;
  uStack_30 = 0xbf800000fffffffe;
  pcStack_80 = err_cb;
  iVar1 = exr_start_read(local_b0);
  if (iVar1 == 0) {
    exr_finish(local_b0);
    in_RCX = 
    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
    ;
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,local_a0,0x34e16f);
    std::__cxx11::string::append((char *)&local_a8);
    iVar1 = exr_start_read(local_b0,local_a8,&local_88);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      __s = (char *)exr_get_default_error_message(iVar1);
      if (__s != (char *)0x0) goto LAB_00146b84;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146b9a;
    }
    exr_finish(local_b0);
    in_RCX = 
    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
    ;
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,local_a0,0x34e16f);
    std::__cxx11::string::append((char *)&local_a8);
    iVar1 = exr_start_read(local_b0,local_a8,&local_88);
    if (iVar1 == 0) {
      exr_finish(local_b0);
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    __s = (char *)exr_get_default_error_message(iVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00146bef;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    __s = (char *)exr_get_default_error_message(iVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xd1,0x34e66e,in_RCX);
LAB_00146b84:
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
LAB_00146b9a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xd6,0x34e66e,in_RCX);
  }
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
LAB_00146bef:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xdb,0x34e66e,in_RCX);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenScans (const std::string& tempdir)
{
    exr_context_t f;
    std::string   fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.1.exr";

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.planar.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.interleaved.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}